

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int __thiscall sptk::swipe::bilookiv(swipe *this,intvector yr_vector,int key,int lo)

{
  int iVar1;
  int hi;
  int md;
  int lo_local;
  int key_local;
  intvector yr_vector_local;
  
  hi = (int)this;
  iVar1 = key + -1;
  while (lo_local = iVar1, 1 < hi - lo_local) {
    iVar1 = hi + lo_local >> 1;
    if ((int)yr_vector.v < *(int *)(yr_vector._0_8_ + (long)iVar1 * 4)) {
      hi = iVar1;
      iVar1 = lo_local;
    }
  }
  return hi;
}

Assistant:

int bilookiv(intvector yr_vector, int key, int lo) {
    int md;
    int hi = yr_vector.x;
    lo--;
    while (hi - lo > 1) {
        md = (hi + lo) >> 1;
        if (yr_vector.v[md] > key)
            hi = md;
        else
            lo = md;
    }
    return(hi);
}